

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(void *ptr_id)

{
  ImGuiID local_24;
  ImGuiWindow *pIStack_20;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  void *ptr_id_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_20 = GImGui->CurrentWindow;
  g = (ImGuiContext *)ptr_id;
  local_24 = ImGuiWindow::GetIDNoKeepAlive(pIStack_20,ptr_id);
  ImVector<unsigned_int>::push_back(&pIStack_20->IDStack,&local_24);
  return;
}

Assistant:

void ImGui::PushID(const void* ptr_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(ptr_id);
    window->IDStack.push_back(id);
}